

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O2

void lj_cconv_ct_init(CTState *cts,CType *d,CTSize sz,uint8_t *dp,TValue *o,MSize len)

{
  int iVar1;
  uint uVar2;
  size_t __n;
  CType *d_00;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  MSize local_34;
  
  __n = (size_t)sz;
  if (len == 1) {
    iVar1 = lj_cconv_multi_init(cts,d,o);
    if (iVar1 == 0) {
      lj_cconv_ct_tv(cts,d,dp,o,0);
      return;
    }
  }
  else if (len == 0) goto LAB_0014be32;
  uVar2 = d->info >> 0x1c;
  if (uVar2 == 1) {
    local_34 = 0;
    memset(dp,0,__n);
    cconv_substruct_init(cts,d,dp,o,len,&local_34);
    if (local_34 < len) {
      cconv_err_initov(cts,d);
    }
  }
  else {
    if (uVar2 != 3) {
      cconv_err_initov(cts,d);
    }
    d_00 = (CType *)((long)&cts->tab->info + (ulong)((d->info & 0xffff) << 4));
    uVar2 = d_00->size;
    if (sz < uVar2 * len) {
      cconv_err_initov(cts,d);
    }
    uVar5 = (ulong)len;
    uVar4 = 0;
    while( true ) {
      uVar3 = (uint)uVar4;
      bVar6 = uVar5 == 0;
      uVar5 = uVar5 - 1;
      if (bVar6) break;
      lj_cconv_ct_tv(cts,d_00,dp + uVar4,o,0);
      uVar4 = (ulong)(uVar3 + uVar2);
      o = o + 1;
    }
    uVar5 = (ulong)uVar2;
    if (uVar2 != uVar3) {
      dp = dp + uVar4;
      __n = (size_t)(sz - uVar3);
LAB_0014be32:
      memset(dp,0,__n);
      return;
    }
    for (; (uint)uVar5 < sz; uVar5 = (ulong)((uint)uVar5 + uVar2)) {
      memcpy(dp + uVar5,dp,(ulong)uVar2);
    }
  }
  return;
}

Assistant:

void lj_cconv_ct_init(CTState *cts, CType *d, CTSize sz,
		      uint8_t *dp, TValue *o, MSize len)
{
  if (len == 0)
    memset(dp, 0, sz);
  else if (len == 1 && !lj_cconv_multi_init(cts, d, o))
    lj_cconv_ct_tv(cts, d, dp, o, 0);
  else if (ctype_isarray(d->info))  /* Also handles valarray init with len>1. */
    cconv_array_init(cts, d, sz, dp, o, len);
  else if (ctype_isstruct(d->info))
    cconv_struct_init(cts, d, sz, dp, o, len);
  else
    cconv_err_initov(cts, d);
}